

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalPrinter<std::optional<SDL_Rect>_>::Print
               (Optional<SDL_Rect> *value,ostream *os)

{
  std::operator<<(os,'(');
  if ((value->super__Optional_base<SDL_Rect,_true,_true>)._M_payload.
      super__Optional_payload_base<SDL_Rect>._M_engaged == false) {
    std::operator<<(os,"nullopt");
  }
  else {
    RawBytesPrinter::PrintValue<SDL_Rect,16ul>((SDL_Rect *)value,os);
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }